

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.hpp
# Opt level: O2

ostream * detail::operator<<(ostream *os,print_bytes<unsigned_long> *s)

{
  uint uVar1;
  undefined8 uVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  undefined1 *puVar7;
  
  uVar6 = s->value;
  puVar7 = _ZL15byte_size_units_rel;
  uVar4 = 0;
  for (uVar5 = 0; (0x3ff < uVar6 && (uVar5 < 8)); uVar5 = uVar5 + 1) {
    uVar4 = (uint)uVar6 & 0x3ff;
    uVar6 = uVar6 >> 10;
    puVar7 = (undefined1 *)((long)puVar7 + 4);
  }
  uVar1 = s->precision;
  if ((uVar6 < 100 || 3 < (int)uVar1) && (1 < (int)uVar1 && (2 < (int)uVar1 || uVar6 < 10))) {
    uVar2 = *(undefined8 *)(&os->field_0x8 + (long)os->_vptr_basic_ostream[-3]);
    *(ulong *)(&os->field_0x8 + (long)os->_vptr_basic_ostream[-3]) = (ulong)uVar1;
    std::ostream::operator<<(os,(float)uVar4 * 0.0009765625 + (float)uVar6);
    *(undefined8 *)(&os->field_0x8 + (long)os->_vptr_basic_ostream[-3]) = uVar2;
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  poVar3 = std::operator<<(os,' ');
  poVar3 = std::operator<<(poVar3,_ZL15byte_size_units_rel + *(int *)puVar7);
  return poVar3;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const print_bytes<T> & s) {
	
	size_t frac = size_t(1024 * (s.value - T(boost::uint64_t(s.value))));
	boost::uint64_t whole = boost::uint64_t(s.value);
	
	size_t i = 0;
	
	while(whole >= 1024 && i < size_t(boost::size(byte_size_units)) - 1) {
		frac = whole % 1024, whole /= 1024;
		i++;
	}
	
	if((whole >= 100 && s.precision <= 3) || (whole >= 10 && s.precision <= 2) || s.precision <= 1) {
		os << whole;
	} else {
		float num = float(whole) + (float(frac) / 1024.f);
		std::streamsize old_precision = os.precision(s.precision);
		os << num;
		os.precision(old_precision);
	}
	
	return os << ' ' << byte_size_units[i];
}